

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O2

QRgb scale_pbm_color(quint16 mx,quint16 rv,quint16 gv,quint16 bv)

{
  uint uVar1;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  ulong uVar2;
  long in_FS_OFFSET;
  QRgba64 local_10;
  long local_8;
  
  uVar2 = CONCAT62(in_register_0000003a,mx);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.rgba =
       (ulong)(uint)((int)CONCAT62(in_register_0000000a,bv) * 0xffff) / (uVar2 & 0xffffffff) << 0x20
       | (ulong)((int)((ulong)(uint)((int)CONCAT62(in_register_00000012,gv) * 0xffff) /
                      (uVar2 & 0xffffffff)) << 0x10 |
                (uint)((ulong)(uint)((int)CONCAT62(in_register_00000032,rv) * 0xffff) /
                      (uVar2 & 0xffffffff)) & 0xffff) | 0xffff000000000000;
  uVar1 = QRgba64::toArgb32(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline QRgb scale_pbm_color(quint16 mx, quint16 rv, quint16 gv, quint16 bv)
{
    return QRgba64::fromRgba64((rv * 0xffffu) / mx, (gv * 0xffffu) / mx, (bv * 0xffffu) / mx, 0xffff).toArgb32();
}